

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

void __thiscall
MinVR::VRDataIndex::_setValueSpecialized(VRDataIndex *this,VRDatumPtr *p,VRIntArray *value)

{
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4> *this_00;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  this_00 = (VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4> *)
            VRDatumPtr::intArrayVal(p);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,value);
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>::setValue
            (this_00,(vector<int,_std::allocator<int>_> *)&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void _setValueSpecialized(VRDatumPtr p, VRIntArray value) {
    p.intArrayVal()->setValue(value);
  }